

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall
ON_String::ToBIG5(ON_String *this,char *buffer,int buffer_length,int *error_count)

{
  bool bVar1;
  undefined8 uVar2;
  ON__UINT32 OVar3;
  bool bVar4;
  Encoding EVar5;
  uint uVar6;
  ON_SimpleArray<ON_Big5UnicodePair> *this_00;
  char *pcVar7;
  ON_Big5UnicodePair *pOVar8;
  int local_f0;
  int local_ec;
  ON_Big5CodePoint local_92;
  int local_90;
  int local_8c;
  int big5_delta;
  int k;
  ON_Big5UnicodePair key;
  ON__UINT32 local_7c;
  ON_Big5UnicodePair pair;
  ON__UINT32 unicode_code_point;
  ON_UnicodeErrorParameters e;
  int i;
  int delta_i;
  int fail_count;
  int big5_code_point_count;
  int code_point_count;
  char *big5_buffer;
  int local_38;
  int big5_len;
  int big5_capacity;
  ON_SimpleArray<ON_Big5UnicodePair> *unicode_to_big5;
  int *error_count_local;
  int buffer_length_local;
  char *buffer_local;
  ON_String *big5;
  
  if (error_count != (int *)0x0) {
    *error_count = 0;
  }
  if (buffer == (char *)0x0) {
    ON_String(this,&EmptyString);
    return (ON_String)(char *)this;
  }
  error_count_local._4_4_ = buffer_length;
  if (buffer_length == -1) {
    error_count_local._4_4_ = Length(buffer);
  }
  if ((error_count_local._4_4_ < 1) || (0xfffffffe < (ulong)(long)error_count_local._4_4_)) {
    ON_String(this,&EmptyString);
    return (ON_String)(char *)this;
  }
  EVar5 = ProbableEncoding(buffer,error_count_local._4_4_);
  if (EVar5 == ASCII) {
LAB_00850b0b:
    ON_String(this,buffer,error_count_local._4_4_);
  }
  else {
    if (EVar5 - UTF8 < 2) {
      this_00 = ON_Big5UnicodePair::UnicodeToBig5();
      local_38 = 0;
      bVar1 = false;
      ON_String(this);
      pcVar7 = ReserveArray(this,(long)(error_count_local._4_4_ * 2 + 1));
      fail_count = 0;
      delta_i = 0;
      i = 0;
      for (e.m_error_code_point = 0; uVar2 = ON_UnicodeErrorParameters::MaskErrors._0_8_,
          (int)e.m_error_code_point < error_count_local._4_4_;
          e.m_error_code_point = local_f0 + e.m_error_code_point) {
        pair.m_big5.m_big5_code_point =
             (undefined2)ON_UnicodeErrorParameters::MaskErrors.m_error_status;
        pair.m_unicode.m_unicode_code_point =
             ON_UnicodeErrorParameters::MaskErrors.m_error_status._2_2_;
        unicode_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
        local_7c = 0x110000;
        ON_UnicodeErrorParameters::MaskErrors._0_8_ = uVar2;
        local_f0 = ON_DecodeUTF8(buffer + (int)e.m_error_code_point,
                                 error_count_local._4_4_ - e.m_error_code_point,
                                 (ON_UnicodeErrorParameters *)&pair,&local_7c);
        fail_count = fail_count + 1;
        key = ON_Big5UnicodePair::Error;
        if ((0 < local_f0) && (bVar4 = ON_IsStandardUnicodeCodePoint(local_7c), bVar4)) {
          if (local_7c < 0x80) {
            k = (int)ON_Big5UnicodePair::Create(local_7c,local_7c);
            key = (ON_Big5UnicodePair)k;
          }
          else {
            big5_delta = (int)ON_Big5UnicodePair::Create(0,local_7c);
            OVar3 = local_7c;
            uVar6 = ON_Big5UnicodePair::UnicodeCodePoint((ON_Big5UnicodePair *)&big5_delta);
            if ((OVar3 == uVar6) &&
               (local_8c = ON_SimpleArray<ON_Big5UnicodePair>::BinarySearch
                                     (this_00,(ON_Big5UnicodePair *)&big5_delta,
                                      ON_Big5UnicodePair::CompareUnicodeCodePoint), -1 < local_8c))
            {
              pOVar8 = ON_SimpleArray<ON_Big5UnicodePair>::operator[](this_00,local_8c);
              key = *pOVar8;
            }
          }
        }
        bVar4 = ON_Big5UnicodePair::IsValid(&key,true,true);
        if (bVar4) {
          local_92 = ON_Big5UnicodePair::Big5(&key);
          local_ec = ON_Big5CodePoint::Encode
                               (&local_92,pcVar7 + local_38,
                                (long)(error_count_local._4_4_ * 2 - local_38));
        }
        else {
          local_ec = 0;
        }
        local_90 = local_ec;
        if ((local_ec == 1) || (local_ec == 2)) {
          if (local_ec == 2) {
            delta_i = delta_i + 1;
          }
          local_38 = local_ec + local_38;
        }
        else {
          pcVar7[local_38] = '?';
          i = i + 1;
          local_38 = local_38 + 1;
        }
        if (local_f0 < 1) {
          local_f0 = 1;
        }
      }
      if ((delta_i < 1) || (fail_count <= i * 2)) {
        bVar4 = false;
      }
      else {
        SetLength(this,(long)local_38);
        bVar1 = true;
        bVar4 = true;
      }
      if (!bVar1) {
        ~ON_String(this);
      }
      if (bVar4) {
        return (ON_String)(char *)this;
      }
    }
    else if (EVar5 == BIG5andASCII) goto LAB_00850b0b;
    ON_String(this,&EmptyString);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToBIG5(
  const char* buffer,
  int buffer_length,
  int* error_count
)
{
  if (nullptr != error_count)
    *error_count = 0;

  if (nullptr == buffer)
    return ON_String::EmptyString;

  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return ON_String::EmptyString;

  switch (ON_String::ProbableEncoding(buffer,buffer_length))
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::BIG5andASCII:
    return ON_String(buffer,buffer_length);
    break;

  case ON_String::Encoding::UTF8:
  case ON_String::Encoding::SloppyUTF8:
  {
    const ON_SimpleArray< ON_Big5UnicodePair>& unicode_to_big5 = ON_Big5UnicodePair::UnicodeToBig5();

    const int big5_capacity = 2 * buffer_length;
    int big5_len = 0;
    ON_String big5;
    char* big5_buffer = big5.ReserveArray(big5_capacity + 1);

    int code_point_count = 0;
    int big5_code_point_count = 0;
    int fail_count = 0;
    int delta_i = 0;
    for (int i = 0; i < buffer_length; i += (delta_i > 0 ? delta_i : 1))
    {
      ON_UnicodeErrorParameters e = ON_UnicodeErrorParameters::MaskErrors;
      e.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
      ON__UINT32 unicode_code_point = e.m_error_code_point;
      delta_i = ON_DecodeUTF8(
        buffer + i,
        buffer_length - i,
        &e,
        &unicode_code_point
      );
      ++code_point_count;

      ON_Big5UnicodePair pair = ON_Big5UnicodePair::Error;
      for (;;)
      {
        if (delta_i <= 0)
          break;
        if (false == ON_IsStandardUnicodeCodePoint(unicode_code_point))
          break;

        if (unicode_code_point >= 0 && unicode_code_point <= 0x7F)
        {
          // ASCII code point.
          pair = ON_Big5UnicodePair::Create(unicode_code_point, unicode_code_point);
          break;
        }

        const ON_Big5UnicodePair key = ON_Big5UnicodePair::Create(0, unicode_code_point);
        if (unicode_code_point != key.UnicodeCodePoint())
          break;
        const int k = unicode_to_big5.BinarySearch(&key, ON_Big5UnicodePair::CompareUnicodeCodePoint);
        if (k < 0)
          break;

        // BIG5 code point
        pair = unicode_to_big5[k];
        break;
      }

      const int big5_delta = pair.IsValid(true, true) ? pair.Big5().Encode(big5_buffer + big5_len, big5_capacity - big5_len) : 0;
      if (1 == big5_delta || 2 == big5_delta)
      {
        if (2 == big5_delta)
          ++big5_code_point_count;
        big5_len += big5_delta;
      }
      else
      {
        big5_buffer[big5_len++] = '?';
        ++fail_count;
      }
    }
    if (big5_code_point_count > 0 && 2 * fail_count < code_point_count)
    {
      big5.SetLength(big5_len);
      return big5;
    }
  }
  break;

  default:
    break;
  }
  return ON_String::EmptyString;
}